

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * createNonrelocSymbol(char *symName,bool numeric)

{
  bool bVar1;
  Symbol *local_28;
  Symbol *sym;
  bool numeric_local;
  char *symName_local;
  
  local_28 = sym_FindExactSymbol(symName);
  if (local_28 == (Symbol *)0x0) {
    local_28 = createsymbol(symName);
  }
  else {
    bVar1 = sym_IsDefined(local_28);
    if (bVar1) {
      error("\'%s\' already defined at ",symName);
      dumpFilename(local_28);
      putc(10,_stderr);
      return (Symbol *)0x0;
    }
    if (!numeric) {
      error("\'%s\' already referenced at ",symName);
      dumpFilename(local_28);
      putc(10,_stderr);
      return (Symbol *)0x0;
    }
  }
  return local_28;
}

Assistant:

static struct Symbol *createNonrelocSymbol(char const *symName, bool numeric)
{
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym) {
		sym = createsymbol(symName);
	} else if (sym_IsDefined(sym)) {
		error("'%s' already defined at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL; // Don't allow overriding the symbol, that'd be bad!
	} else if (!numeric) {
		// The symbol has already been referenced, but it's not allowed
		error("'%s' already referenced at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL; // Don't allow overriding the symbol, that'd be bad!
	}

	return sym;
}